

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalDecoder::Init
          (MeshEdgebreakerTraversalDecoder *this,MeshEdgebreakerDecoderImplInterface *decoder)

{
  uint16_t version;
  PointCloudDecoder *pPVar1;
  DecoderBuffer *pDVar2;
  char *data;
  size_t data_size;
  long *in_RSI;
  DecoderBuffer *in_RDI;
  
  in_RDI[3].bit_decoder_.bit_offset_ = (size_t)in_RSI;
  pPVar1 = (PointCloudDecoder *)(**(code **)(*in_RSI + 0x40))();
  pDVar2 = PointCloudDecoder::buffer(pPVar1);
  data = DecoderBuffer::data_head(pDVar2);
  pPVar1 = (PointCloudDecoder *)(**(code **)(*in_RSI + 0x40))();
  pDVar2 = PointCloudDecoder::buffer(pPVar1);
  data_size = DecoderBuffer::remaining_size(pDVar2);
  pPVar1 = (PointCloudDecoder *)(**(code **)(*in_RSI + 0x40))();
  pDVar2 = PointCloudDecoder::buffer(pPVar1);
  version = DecoderBuffer::bitstream_version(pDVar2);
  DecoderBuffer::Init(in_RDI,data,data_size,version);
  return;
}

Assistant:

void Init(MeshEdgebreakerDecoderImplInterface *decoder) {
    decoder_impl_ = decoder;
    buffer_.Init(decoder->GetDecoder()->buffer()->data_head(),
                 decoder->GetDecoder()->buffer()->remaining_size(),
                 decoder->GetDecoder()->buffer()->bitstream_version());
  }